

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O1

Vec_Wec_t *
Acec_FindXorLeaves(Gia_Man_t *p,Vec_Int_t *vXors,Vec_Int_t *vAdds,Vec_Int_t *vXorRoots,
                  Vec_Int_t *vRanks,Vec_Wec_t **pvAddBoxes)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Vec_Bit_t *__ptr;
  Vec_Int_t *__ptr_00;
  Vec_Wec_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Wec_t *pVVar11;
  ulong uVar12;
  size_t __size;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  __ptr = Acec_MapXorOuts2(p,vXors,vRanks);
  __ptr_00 = Acec_MapMajOuts2(p,vAdds,vRanks);
  iVar1 = vXorRoots->nSize;
  pVVar9 = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar10 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar10 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  pVVar9->pArray = pVVar10;
  pVVar9->nSize = iVar1;
  pVVar11 = (Vec_Wec_t *)malloc(0x10);
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar10 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar10 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  pVVar11->pArray = pVVar10;
  pVVar11->nSize = iVar1;
  if (0 < vXors->nSize) {
    uVar8 = 0;
    do {
      uVar12 = (ulong)uVar8;
      iVar1 = vXors->pArray[uVar12];
      lVar13 = (long)iVar1;
      if ((lVar13 < 0) || (vRanks->nSize <= iVar1)) {
LAB_0067ebde:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = vRanks->pArray[lVar13];
      uVar15 = (ulong)uVar2;
      if (uVar15 != 0xffffffff) {
        iVar6 = uVar2 + 1;
        lVar14 = 3;
        do {
          uVar12 = uVar12 + 1;
          if (vXors->nSize <= (int)uVar12) goto LAB_0067ebde;
          uVar7 = vXors->pArray[uVar12];
          uVar16 = (ulong)uVar7;
          if (uVar16 != 0) {
            if (((int)uVar7 < 0) || (__ptr->nSize <= (int)uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if (((uint)__ptr->pArray[uVar7 >> 5] >> (uVar7 & 0x1f) & 1) == 0) {
              if (__ptr_00->nSize <= (int)uVar7) goto LAB_0067ebde;
              uVar3 = __ptr_00->pArray[uVar16];
              if (uVar3 == 0xffffffff) {
                if (pVVar9->nSize <= (int)uVar2) {
                  iVar5 = pVVar9->nSize * 2;
                  if (iVar5 <= iVar6) {
                    iVar5 = iVar6;
                  }
                  iVar4 = pVVar9->nCap;
                  if (iVar4 < iVar5) {
                    if (pVVar9->pArray == (Vec_Int_t *)0x0) {
                      pVVar10 = (Vec_Int_t *)malloc((long)iVar5 << 4);
                    }
                    else {
                      pVVar10 = (Vec_Int_t *)realloc(pVVar9->pArray,(long)iVar5 << 4);
                    }
                    pVVar9->pArray = pVVar10;
                    memset(pVVar10 + iVar4,0,(long)(iVar5 - iVar4) << 4);
                    pVVar9->nCap = iVar5;
                  }
                  pVVar9->nSize = iVar6;
                }
                if (((int)uVar2 < 0) || (pVVar9->nSize <= (int)uVar2)) {
LAB_0067ec3b:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
                }
                pVVar10 = pVVar9->pArray + uVar15;
              }
              else {
                if (vRanks->nSize <= iVar1) goto LAB_0067ebde;
                if (vRanks->pArray[lVar13] < 1) goto LAB_0067eb49;
                if (pVVar11->nSize < (int)uVar2) {
                  uVar7 = pVVar11->nSize * 2;
                  if ((int)uVar7 <= (int)uVar2) {
                    uVar7 = uVar2;
                  }
                  if (pVVar11->nCap < (int)uVar7) {
                    __size = (long)(int)uVar7 << 4;
                    if (pVVar11->pArray == (Vec_Int_t *)0x0) {
                      pVVar10 = (Vec_Int_t *)malloc(__size);
                    }
                    else {
                      pVVar10 = (Vec_Int_t *)realloc(pVVar11->pArray,__size);
                    }
                    pVVar11->pArray = pVVar10;
                    memset(pVVar10 + pVVar11->nCap,0,((long)(int)uVar7 - (long)pVVar11->nCap) * 0x10
                          );
                    pVVar11->nCap = uVar7;
                  }
                  pVVar11->nSize = uVar2;
                }
                if (((int)uVar2 < 1) || (pVVar11->nSize < (int)uVar2)) goto LAB_0067ec3b;
                pVVar10 = pVVar11->pArray + (uVar15 - 1);
                uVar7 = uVar3;
              }
              Vec_IntPush(pVVar10,uVar7);
            }
            else {
              if (vRanks->nSize <= (int)uVar7) goto LAB_0067ebde;
              if (uVar2 != vRanks->pArray[uVar16]) {
                __assert_fail("Rank == Vec_IntEntry(vRanks, Fanin)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c"
                              ,0xf8,
                              "Vec_Wec_t *Acec_FindXorLeaves(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t **)"
                             );
              }
            }
          }
LAB_0067eb49:
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      uVar8 = uVar8 + 4;
    } while ((int)uVar8 < vXors->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Bit_t *)0x0) {
    free(__ptr);
  }
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
  }
  if (pvAddBoxes != (Vec_Wec_t **)0x0) {
    *pvAddBoxes = pVVar11;
  }
  return pVVar9;
}

Assistant:

Vec_Wec_t * Acec_FindXorLeaves( Gia_Man_t * p, Vec_Int_t * vXors, Vec_Int_t * vAdds, Vec_Int_t * vXorRoots, Vec_Int_t * vRanks, Vec_Wec_t ** pvAddBoxes )
{
    Vec_Bit_t * vMapXors = Acec_MapXorOuts2( p, vXors, vRanks );
    Vec_Int_t * vMapMajs = Acec_MapMajOuts2( p, vAdds, vRanks );
    Vec_Wec_t * vXorLeaves = Vec_WecStart( Vec_IntSize(vXorRoots) );
    Vec_Wec_t * vAddBoxes  = Vec_WecStart( Vec_IntSize(vXorRoots) );
    int i, k;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        int Xor = Vec_IntEntry(vXors, 4*i);
        int Rank = Vec_IntEntry(vRanks, Xor);
        if ( Rank == -1 )
            continue;
        for ( k = 1; k < 4; k++ )
        {
            int Fanin = Vec_IntEntry(vXors, 4*i+k);
            //int RankFanin = Vec_IntEntry(vRanks, Fanin);
            if ( Fanin == 0 )
                continue;
            if ( Vec_BitEntry(vMapXors, Fanin) )
            {
                assert( Rank == Vec_IntEntry(vRanks, Fanin) );
                continue;
            }
//            if ( Vec_BitEntry(vMapXors, Fanin) && Rank == RankFanin )
//                continue;
            if ( Vec_IntEntry(vMapMajs, Fanin) == -1 ) // no adder driving this input
                Vec_WecPush( vXorLeaves, Rank, Fanin );
            else if ( Vec_IntEntry(vRanks, Xor) > 0 ) // save adder box
                Vec_WecPush( vAddBoxes, Rank-1, Vec_IntEntry(vMapMajs, Fanin) );
        }
    }
    Vec_BitFree( vMapXors );
    Vec_IntFree( vMapMajs );
    if ( pvAddBoxes )
        *pvAddBoxes = vAddBoxes;
    return vXorLeaves;
}